

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

AggregateInitialiserList * __thiscall
soul::heart::Parser::parseInitialiserList(Parser *this,FunctionParseState *state,Type *type)

{
  Module *pMVar1;
  size_t sVar2;
  bool bVar3;
  AggregateInitialiserList *pAVar4;
  Expression *pEVar5;
  anon_class_1_0_00000001 getAggregateElementType;
  anon_class_1_0_00000001 local_51;
  FunctionParseState *local_50;
  Type local_48;
  
  pMVar1 = (this->module).object;
  local_50 = state;
  if (pMVar1 != (Module *)0x0) {
    pAVar4 = PoolAllocator::
             allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation&,soul::Type_const&>
                       (&pMVar1->allocator->pool,
                        &(this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ).location,type);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27f6d5);
    bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27d2c7);
    if (!bVar3) {
      do {
        parseInitialiserList::anon_class_1_0_00000001::operator()
                  (&local_48,&local_51,type,(uint32_t)(pAVar4->items).numActive);
        pEVar5 = parseExpression(this,local_50,&local_48);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
        ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                  (&pAVar4->items,(pAVar4->items).numActive + 1);
        sVar2 = (pAVar4->items).numActive;
        (pAVar4->items).items[sVar2].object = pEVar5;
        (pAVar4->items).numActive = sVar2 + 1;
        bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x259fab);
      } while (bVar3);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x27d2c7);
    }
    return pAVar4;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

heart::AggregateInitialiserList& parseInitialiserList (const FunctionParseState& state, const Type& type)
    {
        auto& list = module->allocate<heart::AggregateInitialiserList> (location, type);
        expect (HEARTOperator::openParen);

        auto getAggregateElementType = [] (const Type& t, uint32_t index)
        {
            if (t.isFixedSizeAggregate())
            {
                SOUL_ASSERT (index < t.getNumAggregateElements());
                return t.isStruct() ? t.getStructRef().getMemberType (index)
                                    : t.getElementType();
            }

            SOUL_ASSERT (index == 0);
            return t;
        };

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto& arg = parseExpression (state, getAggregateElementType (type, static_cast<uint32_t> (list.items.size())));
                list.items.push_back (arg);

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        return list;
    }